

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O2

cmCTestGenericHandler * __thiscall cmCTestBuildCommand::InitializeHandler(cmCTestBuildCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  cmCTestBuildHandler *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  string *psVar8;
  pointer ppcVar9;
  char *pcVar10;
  cmake *this_00;
  cmGlobalGenerator *pcVar11;
  ostream *poVar12;
  char *pcVar13;
  allocator local_22b;
  allocator local_22a;
  allocator local_229;
  string dir;
  string local_208;
  string buildCommand;
  string e;
  string local_50;
  
  pcVar4 = (cmCTestBuildHandler *)
           cmCTest::GetInitializedHandler
                     ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"build");
  if (pcVar4 == (cmCTestBuildHandler *)0x0) {
    std::__cxx11::string::string
              ((string *)&e,"internal CTest error. Cannot instantiate build handler",
               (allocator *)&dir);
    cmCommand::SetError((cmCommand *)this,&e);
LAB_00307c10:
    std::__cxx11::string::~string((string *)&e);
LAB_00307c68:
    pcVar4 = (cmCTestBuildHandler *)0x0;
  }
  else {
    this->Handler = pcVar4;
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string((string *)&e,"CTEST_BUILD_COMMAND",(allocator *)&dir);
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&e);
    std::__cxx11::string::~string((string *)&e);
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string((string *)&e,"CTEST_CMAKE_GENERATOR",(allocator *)&dir);
      pcVar6 = cmMakefile::GetDefinition(pcVar1,&e);
      std::__cxx11::string::~string((string *)&e);
      pcVar5 = (this->super_cmCTestHandlerCommand).Values.
               super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[0xb];
      if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::__cxx11::string::string((string *)&e,"CTEST_PROJECT_NAME",(allocator *)&dir);
        pcVar5 = cmMakefile::GetDefinition(pcVar1,&e);
        std::__cxx11::string::~string((string *)&e);
      }
      pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
      std::__cxx11::string::string((string *)&e,"CTEST_BUILD_CONFIGURATION",(allocator *)&dir);
      pcVar7 = cmMakefile::GetDefinition(pcVar1,&e);
      std::__cxx11::string::~string((string *)&e);
      ppcVar9 = (this->super_cmCTestHandlerCommand).Values.
                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar13 = ppcVar9[9];
      if (((pcVar13 == (char *)0x0) || (*pcVar13 == '\0')) &&
         ((pcVar7 == (char *)0x0 || (pcVar13 = pcVar7, *pcVar7 == '\0')))) {
        psVar8 = cmCTest::GetConfigType_abi_cxx11_
                           ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
        pcVar13 = (psVar8->_M_dataplus)._M_p;
        ppcVar9 = (this->super_cmCTestHandlerCommand).Values.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pcVar7 = ppcVar9[10];
      if ((pcVar7 == (char *)0x0) || (*pcVar7 == '\0')) {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::__cxx11::string::string((string *)&e,"CTEST_BUILD_FLAGS",(allocator *)&dir);
        pcVar7 = cmMakefile::GetDefinition(pcVar1,&e);
        std::__cxx11::string::~string((string *)&e);
        ppcVar9 = (this->super_cmCTestHandlerCommand).Values.
                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pcVar10 = ppcVar9[8];
      if ((pcVar10 == (char *)0x0) || (*pcVar10 == '\0')) {
        pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
        std::__cxx11::string::string((string *)&e,"CTEST_BUILD_TARGET",(allocator *)&dir);
        pcVar10 = cmMakefile::GetDefinition(pcVar1,&e);
        std::__cxx11::string::~string((string *)&e);
      }
      if ((((pcVar6 == (char *)0x0) || (pcVar5 == (char *)0x0)) || (*pcVar6 == '\0')) ||
         (*pcVar5 == '\0')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        std::operator<<((ostream *)&e,
                        "has no project to build. If this is a \"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR and CTEST_PROJECT_NAME are set.\nCTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify that CTestConfig.cmake exists, or CTEST_PROJECT_NAME is set in the script, or PROJECT_NAME is passed as an argument to ctest_build.\nAlternatively, set CTEST_BUILD_COMMAND to build the project with a custom command line."
                       );
        std::__cxx11::stringbuf::str();
        cmCommand::SetError((cmCommand *)this,&dir);
        std::__cxx11::string::~string((string *)&dir);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        goto LAB_00307c68;
      }
      pcVar5 = "Release";
      if (pcVar13 != (char *)0x0) {
        pcVar5 = pcVar13;
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
LAB_00307c85:
        this_00 = cmMakefile::GetCMakeInstance
                            ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.
                             super_cmCommand.Makefile);
        std::__cxx11::string::string((string *)&e,pcVar6,(allocator *)&dir);
        pcVar11 = cmake::CreateGlobalGenerator(this_00,&e);
        this->GlobalGenerator = pcVar11;
        std::__cxx11::string::~string((string *)&e);
        if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
          std::__cxx11::string::string
                    ((string *)&e,"could not create generator named \"",(allocator *)&dir);
          std::__cxx11::string::append((char *)&e);
          std::__cxx11::string::append((char *)&e);
          cmMakefile::IssueMessage
                    ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                     Makefile,FATAL_ERROR,&e,false);
          cmSystemTools::s_FatalErrorOccured = true;
          goto LAB_00307c10;
        }
      }
      else {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&e);
        bVar3 = std::operator!=(&e,pcVar6);
        std::__cxx11::string::~string((string *)&e);
        pcVar11 = this->GlobalGenerator;
        if (bVar3) {
          if (pcVar11 != (cmGlobalGenerator *)0x0) {
            (*pcVar11->_vptr_cmGlobalGenerator[1])();
          }
          this->GlobalGenerator = (cmGlobalGenerator *)0x0;
          goto LAB_00307c85;
        }
        if (pcVar11 == (cmGlobalGenerator *)0x0) goto LAB_00307c85;
      }
      pcVar6 = "Debug";
      if (*pcVar5 != '\0') {
        pcVar6 = pcVar5;
      }
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::string::string((string *)&e,"BuildDirectory",(allocator *)&buildCommand);
      cmCTest::GetCTestConfiguration(&dir,pcVar2,&e);
      std::__cxx11::string::~string((string *)&e);
      pcVar11 = this->GlobalGenerator;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = "";
      }
      std::__cxx11::string::string((string *)&e,pcVar10,&local_229);
      std::__cxx11::string::string((string *)&local_208,pcVar6,&local_22a);
      pcVar5 = "";
      if (pcVar7 != (char *)0x0) {
        pcVar5 = pcVar7;
      }
      std::__cxx11::string::string((string *)&local_50,pcVar5,&local_22b);
      bVar3 = cmMakefile::IgnoreErrorsCMP0061
                        ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.
                         Makefile);
      cmGlobalGenerator::GenerateCMakeBuildCommand
                (&buildCommand,pcVar11,&e,&local_208,&local_50,bVar3);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&e);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar12 = std::operator<<((ostream *)&e,"SetMakeCommand:");
      poVar12 = std::operator<<(poVar12,(string *)&buildCommand);
      std::operator<<(poVar12,"\n");
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestBuildCommand.cxx"
                   ,0x93,local_208._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",
                 buildCommand._M_dataplus._M_p,(this->super_cmCTestHandlerCommand).Quiet);
      std::__cxx11::string::~string((string *)&buildCommand);
      std::__cxx11::string::~string((string *)&dir);
    }
    else {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"MakeCommand",pcVar5
                 ,(this->super_cmCTestHandlerCommand).Quiet);
    }
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    std::__cxx11::string::string((string *)&e,"CTEST_USE_LAUNCHERS",(allocator *)&dir);
    pcVar5 = cmMakefile::GetDefinition(pcVar1,&e);
    std::__cxx11::string::~string((string *)&e);
    if (pcVar5 != (char *)0x0) {
      cmCTest::SetCTestConfiguration
                ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"UseLaunchers",
                 pcVar5,(this->super_cmCTestHandlerCommand).Quiet);
    }
    (pcVar4->super_cmCTestGenericHandler).Quiet = (this->super_cmCTestHandlerCommand).Quiet;
  }
  return &pcVar4->super_cmCTestGenericHandler;
}

Assistant:

cmCTestGenericHandler* cmCTestBuildCommand::InitializeHandler()
{
  cmCTestGenericHandler* handler
    = this->CTest->GetInitializedHandler("build");
  if ( !handler )
    {
    this->SetError("internal CTest error. Cannot instantiate build handler");
    return 0;
    }
  this->Handler =  (cmCTestBuildHandler*)handler;

  const char* ctestBuildCommand
    = this->Makefile->GetDefinition("CTEST_BUILD_COMMAND");
  if ( ctestBuildCommand && *ctestBuildCommand )
    {
    this->CTest->SetCTestConfiguration("MakeCommand", ctestBuildCommand,
      this->Quiet);
    }
  else
    {
    const char* cmakeGeneratorName
      = this->Makefile->GetDefinition("CTEST_CMAKE_GENERATOR");
    const char* cmakeProjectName
      = (this->Values[ctb_PROJECT_NAME] && *this->Values[ctb_PROJECT_NAME])
      ? this->Values[ctb_PROJECT_NAME]
      : this->Makefile->GetDefinition("CTEST_PROJECT_NAME");

    // Build configuration is determined by: CONFIGURATION argument,
    // or CTEST_BUILD_CONFIGURATION script variable, or
    // CTEST_CONFIGURATION_TYPE script variable, or ctest -C command
    // line argument... in that order.
    //
    const char* ctestBuildConfiguration
      = this->Makefile->GetDefinition("CTEST_BUILD_CONFIGURATION");
    const char* cmakeBuildConfiguration
      = (this->Values[ctb_CONFIGURATION] && *this->Values[ctb_CONFIGURATION])
      ? this->Values[ctb_CONFIGURATION]
      : ((ctestBuildConfiguration && *ctestBuildConfiguration)
        ? ctestBuildConfiguration
        : this->CTest->GetConfigType().c_str());

    const char* cmakeBuildAdditionalFlags
      = (this->Values[ctb_FLAGS] && *this->Values[ctb_FLAGS])
      ? this->Values[ctb_FLAGS]
      : this->Makefile->GetDefinition("CTEST_BUILD_FLAGS");
    const char* cmakeBuildTarget
      = (this->Values[ctb_TARGET] && *this->Values[ctb_TARGET])
      ? this->Values[ctb_TARGET]
      : this->Makefile->GetDefinition("CTEST_BUILD_TARGET");

    if ( cmakeGeneratorName && *cmakeGeneratorName &&
      cmakeProjectName && *cmakeProjectName )
      {
      if ( !cmakeBuildConfiguration )
        {
        cmakeBuildConfiguration = "Release";
        }
      if ( this->GlobalGenerator )
        {
        if ( this->GlobalGenerator->GetName() != cmakeGeneratorName )
          {
          delete this->GlobalGenerator;
          this->GlobalGenerator = 0;
          }
        }
      if ( !this->GlobalGenerator )
        {
        this->GlobalGenerator =
          this->Makefile->GetCMakeInstance()->CreateGlobalGenerator(
            cmakeGeneratorName);
        if(!this->GlobalGenerator)
          {
          std::string e = "could not create generator named \"";
          e += cmakeGeneratorName;
          e += "\"";
          this->Makefile->IssueMessage(cmake::FATAL_ERROR, e);
          cmSystemTools::SetFatalErrorOccured();
          return 0;
          }
        }
      if(strlen(cmakeBuildConfiguration) == 0)
        {
        const char* config = 0;
#ifdef CMAKE_INTDIR
        config = CMAKE_INTDIR;
#endif
        if(!config)
          {
          config = "Debug";
          }
        cmakeBuildConfiguration = config;
        }

      std::string dir = this->CTest->GetCTestConfiguration("BuildDirectory");
      std::string buildCommand
        = this->GlobalGenerator->
        GenerateCMakeBuildCommand(cmakeBuildTarget ? cmakeBuildTarget : "",
          cmakeBuildConfiguration,
          cmakeBuildAdditionalFlags ? cmakeBuildAdditionalFlags : "",
          this->Makefile->IgnoreErrorsCMP0061());
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
        "SetMakeCommand:" << buildCommand << "\n", this->Quiet);
      this->CTest->SetCTestConfiguration("MakeCommand", buildCommand.c_str(),
        this->Quiet);
      }
    else
      {
      std::ostringstream ostr;
      ostr << "has no project to build. If this is a "
        "\"built with CMake\" project, verify that CTEST_CMAKE_GENERATOR "
        "and CTEST_PROJECT_NAME are set."
        "\n"
        "CTEST_PROJECT_NAME is usually set in CTestConfig.cmake. Verify "
        "that CTestConfig.cmake exists, or CTEST_PROJECT_NAME "
        "is set in the script, or PROJECT_NAME is passed as an argument "
        "to ctest_build."
        "\n"
        "Alternatively, set CTEST_BUILD_COMMAND to build the project "
        "with a custom command line.";
      this->SetError(ostr.str());
      return 0;
      }
    }

  if(const char* useLaunchers =
     this->Makefile->GetDefinition("CTEST_USE_LAUNCHERS"))
    {
    this->CTest->SetCTestConfiguration("UseLaunchers", useLaunchers,
      this->Quiet);
    }

  handler->SetQuiet(this->Quiet);
  return handler;
}